

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

Gia_Man_t * Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *pNtk,Vec_Ptr_t **pvBuffers,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint local_80;
  uint local_58;
  int local_54;
  int Counter;
  int i;
  Vec_Ptr_t *vBuffers;
  Vec_Ptr_t *vSupers;
  Abc_Obj_t *pTerm;
  Abc_Ntk_t *pModel;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fUseBufs;
  int fVerbose_local;
  Vec_Ptr_t **pvBuffers_local;
  Abc_Ntk_t *pNtk_local;
  
  pNew._0_4_ = 1;
  pNew._4_4_ = fVerbose;
  _fUseBufs = pvBuffers;
  pvBuffers_local = (Vec_Ptr_t **)pNtk;
  _Counter = Vec_PtrAlloc(1000);
  iVar1 = Abc_NtkIsNetlist((Abc_Ntk_t *)pvBuffers_local);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pvBuffers_local);
    iVar2 = Abc_NtkPoNum((Abc_Ntk_t *)pvBuffers_local);
    local_58 = -(iVar1 + iVar2);
    if (pvBuffers_local[0x16] == (Vec_Ptr_t *)0x0) {
      iVar1 = Gia_ManFlattenLogicPrepare((Abc_Ntk_t *)pvBuffers_local);
      local_58 = iVar1 + local_58;
    }
    else {
      for (local_54 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pvBuffers_local[0x16][1].pArray),
          local_54 < iVar1; local_54 = local_54 + 1) {
        pTerm = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pvBuffers_local[0x16][1].pArray,local_54);
        iVar1 = Gia_ManFlattenLogicPrepare((Abc_Ntk_t *)pTerm);
        local_58 = iVar1 + local_58;
      }
    }
    iVar1 = Abc_NtkObjNumMax((Abc_Ntk_t *)pvBuffers_local);
    pTemp = Gia_ManStart(iVar1);
    pcVar4 = Abc_UtilStrsav((char *)pvBuffers_local[1]);
    pTemp->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav((char *)pvBuffers_local[2]);
    pTemp->pSpec = pcVar4;
    for (local_54 = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pvBuffers_local), local_54 < iVar1;
        local_54 = local_54 + 1) {
      vSupers = (Vec_Ptr_t *)Abc_NtkPi((Abc_Ntk_t *)pvBuffers_local,local_54);
      iVar1 = Gia_ManAppendCi(pTemp);
      vSupers[4].nCap = iVar1;
    }
    vBuffers = Vec_PtrAlloc(100);
    Gia_ManHashAlloc(pTemp);
    for (local_54 = 0; iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)pvBuffers_local), local_54 < iVar1;
        local_54 = local_54 + 1) {
      vSupers = (Vec_Ptr_t *)Abc_NtkPo((Abc_Ntk_t *)pvBuffers_local,local_54);
      Abc_NtkFlattenHierarchyGia_rec(pTemp,vBuffers,(Abc_Obj_t *)vSupers,_Counter);
    }
    Gia_ManHashStop(pTemp);
    Vec_PtrFree(vBuffers);
    if (pvBuffers_local[0x16] == (Vec_Ptr_t *)0x0) {
      local_80 = 0;
    }
    else {
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)pvBuffers_local[0x16][1].pArray);
      local_80 = iVar1 - 1;
    }
    uVar3 = Vec_PtrSize(_Counter);
    printf("Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n",
           (ulong)local_80,(ulong)uVar3,(ulong)local_58);
    for (local_54 = 0; iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)pvBuffers_local), local_54 < iVar1;
        local_54 = local_54 + 1) {
      vSupers = (Vec_Ptr_t *)Abc_NtkPo((Abc_Ntk_t *)pvBuffers_local,local_54);
      Gia_ManAppendCo(pTemp,(((Abc_Obj_t *)vSupers)->field_6).iTemp);
    }
    if (_fUseBufs == (Vec_Ptr_t **)0x0) {
      Vec_PtrFreeP((Vec_Ptr_t **)&Counter);
    }
    else {
      *_fUseBufs = _Counter;
    }
    pModel = (Abc_Ntk_t *)pTemp;
    pTemp = Gia_ManCleanup(pTemp);
    Gia_ManStop((Gia_Man_t *)pModel);
    pModel = (Abc_Ntk_t *)pTemp;
    pTemp = Gia_ManSweepHierarchy(pTemp);
    Gia_ManStop((Gia_Man_t *)pModel);
    return pTemp;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                ,0x1ab,"Gia_Man_t *Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *, Vec_Ptr_t **, int)");
}

Assistant:

Gia_Man_t * Abc_NtkFlattenHierarchyGia( Abc_Ntk_t * pNtk, Vec_Ptr_t ** pvBuffers, int fVerbose )
{
    int fUseBufs = 1;
    Gia_Man_t * pNew, * pTemp; 
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pTerm;
    Vec_Ptr_t * vSupers;
    Vec_Ptr_t * vBuffers = fUseBufs ? Vec_PtrAlloc(1000) : NULL;
    int i, Counter = 0; 
    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );

    // set the PI/PO numbers
    Counter -= Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk);
    if ( !pNtk->pDesign )
        Counter += Gia_ManFlattenLogicPrepare( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Counter += Gia_ManFlattenLogicPrepare( pModel );

    // start the manager
    pNew = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);

    // create PIs and buffers
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iTemp = Gia_ManAppendCi( pNew );

    // call recursively
    vSupers = Vec_PtrAlloc( 100 );
    Gia_ManHashAlloc( pNew );
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pTerm, vBuffers );
    Gia_ManHashStop( pNew );
    Vec_PtrFree( vSupers );
    printf( "Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n", 
        pNtk->pDesign ? Vec_PtrSize(pNtk->pDesign->vModules)-1 : 0, Vec_PtrSize(vBuffers), Counter );

    // create buffers and POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pNew, pTerm->iTemp );

    if ( pvBuffers )
        *pvBuffers = vBuffers;
    else
        Vec_PtrFreeP( &vBuffers );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManSweepHierarchy( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}